

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

void __thiscall ANN::addLayer(ANN *this,int size,string *type)

{
  long lVar1;
  void *pvVar2;
  vector<Layer_*,_std::allocator<Layer_*>_> *this_00;
  string *in_RDX;
  undefined4 in_ESI;
  value_type *in_RDI;
  string *in_stack_00000008;
  double *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  Filter *in_stack_00000020;
  string *in_stack_00000058;
  double *in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  Dense *in_stack_00000070;
  value_type *in_stack_ffffffffffffff28;
  vector<Layer_*,_std::allocator<Layer_*>_> *in_stack_ffffffffffffff30;
  string local_78 [32];
  vector<Layer_*,_std::allocator<Layer_*>_> *local_58;
  undefined1 local_4d;
  string local_40 [32];
  void *local_20;
  
  *(undefined4 *)((long)in_RDI + 0x34) = in_ESI;
  lVar1 = std::__cxx11::string::rfind((char *)in_RDX,0x17d230);
  if (((lVar1 != 0) && (lVar1 = std::__cxx11::string::rfind((char *)in_RDX,0x17d238), lVar1 != 0))
     && (lVar1 = std::__cxx11::string::rfind((char *)in_RDX,0x17d241), lVar1 != 0)) {
    this_00 = (vector<Layer_*,_std::allocator<Layer_*>_> *)operator_new(0x90);
    std::__cxx11::string::string(local_78,in_RDX);
    Dense::Dense(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                 in_stack_00000058);
    local_58 = this_00;
    std::vector<Layer_*,_std::allocator<Layer_*>_>::push_back(this_00,in_RDI);
    std::__cxx11::string::~string(local_78);
    return;
  }
  pvVar2 = operator_new(0xa0);
  local_4d = 1;
  std::__cxx11::string::string(local_40,in_RDX);
  Filter::Filter(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010,
                 in_stack_00000008);
  local_4d = 0;
  local_20 = pvVar2;
  std::vector<Layer_*,_std::allocator<Layer_*>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ANN::addLayer(int size, string type) {
    outputSize = size;
    if(type.rfind("lowpass", 0) == 0 || type.rfind("highpass", 0) == 0 || type.rfind("passband", 0) == 0) {
        layers.push_back(new Filter(inputSize, size, &learning_rate, type));
    }
    else {
        layers.push_back(new Dense(inputSize, size, &learning_rate, type));
    }
}